

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

pair<mjs::token,_unsigned_long> *
mjs::anon_unknown_2::skip_comment
          (pair<mjs::token,_unsigned_long> *__return_storage_ptr__,wstring_view *text,size_t pos,
          version v)

{
  long lVar1;
  wchar_t wVar2;
  ulong uVar3;
  wchar_t *pwVar4;
  runtime_error *this;
  byte bVar5;
  byte bVar6;
  unsigned_long uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  token local_40;
  
  uVar3 = text->_M_len;
  if (uVar3 <= pos) {
    __assert_fail("pos < text.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp",
                  0x89,
                  "std::pair<token, size_t> mjs::(anonymous namespace)::skip_comment(const std::wstring_view &, size_t, version)"
                 );
  }
  pwVar4 = text->_M_str;
  wVar2 = pwVar4[pos];
  if ((wVar2 != L'*') && (wVar2 != L'/')) {
    __assert_fail("text[pos] == \'/\' || text[pos] == \'*\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp",
                  0x8a,
                  "std::pair<token, size_t> mjs::(anonymous namespace)::skip_comment(const std::wstring_view &, size_t, version)"
                 );
  }
  uVar8 = pos + 1;
  if (wVar2 != L'/') {
    if (uVar8 < uVar3) {
      uVar7 = pos + 2;
      bVar5 = 0;
      bVar10 = false;
      do {
        wVar2 = pwVar4[uVar7 - 1];
        if (!(bool)(~bVar10 & 1U | wVar2 != L'/')) {
          local_40.type_ = (token_type)bVar5;
          (__return_storage_ptr__->first).type_ = eof;
          token::operator=(&__return_storage_ptr__->first,&local_40);
          __return_storage_ptr__->second = uVar7;
          token::destroy(&local_40);
          return __return_storage_ptr__;
        }
        bVar10 = wVar2 == L'*';
        bVar6 = 1;
        if ((wVar2 != L'\n') && (wVar2 != L'\r')) {
          bVar6 = bVar5;
          if ((wVar2 & 0xfffffffeU) == 0x2028) {
            bVar6 = 1;
          }
          if (v == es1) {
            bVar6 = bVar5;
          }
        }
        bVar5 = bVar6;
        lVar1 = (1 - uVar3) + uVar7;
        uVar7 = uVar7 + 1;
      } while (lVar1 != 1);
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Unterminated multi-line comment");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar9 = uVar8;
  if (uVar8 < uVar3) {
    do {
      wVar2 = pwVar4[uVar8];
      uVar9 = uVar8;
      if (((wVar2 == L'\n') || (wVar2 == L'\r')) ||
         ((v != es1 && ((wVar2 & 0xfffffffeU) == 0x2028)))) break;
      uVar8 = uVar8 + 1;
      uVar9 = uVar3;
    } while (uVar3 != uVar8);
  }
  local_40.type_ = whitespace;
  (__return_storage_ptr__->first).type_ = eof;
  token::operator=(&__return_storage_ptr__->first,&local_40);
  __return_storage_ptr__->second = uVar9;
  token::destroy(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::pair<token, size_t> skip_comment(const std::wstring_view& text, size_t pos, version v) {
    assert(pos < text.size());
    assert(text[pos] == '/' || text[pos] == '*');
    const bool is_single_line = text[pos++] == '/';
    if (is_single_line) {
        for (; pos < text.size(); ++pos) {
            if (is_line_terminator(text[pos], v)) {
                // Don't consume line terminator
                break;
            }
        }
        return {token{token_type::whitespace}, pos};
    } else {
        for (bool last_was_asterisk = false, line_terminator_seen = false; pos < text.size(); ++pos) {
            if (text[pos] == '/' && last_was_asterisk) {
                return {token{line_terminator_seen ? token_type::line_terminator : token_type::whitespace}, ++pos};
            }
            last_was_asterisk = text[pos] == '*';
            if (is_line_terminator(text[pos], v)) {
                line_terminator_seen = true;
            }
        }
        throw std::runtime_error("Unterminated multi-line comment");
    }
}